

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::generateCode(Generator *this)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar2;
  Data *pDVar3;
  SuperClass *pSVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  qsizetype __s2;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  P _a;
  const_iterator cVar11;
  QFlags<QtMocConstants::EnumFlags> *pQVar12;
  void *pvVar13;
  long lVar14;
  longlong lVar15;
  QStringTokenizerBaseBase QVar16;
  _Rb_tree_node_base *p_Var17;
  QList<ClassDef::Interface> *pQVar18;
  ClassDef *pCVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  undefined8 *puVar23;
  QByteArray *pQVar24;
  long lVar25;
  long lVar26;
  EnumDef *pEVar27;
  QStringTokenizerBase<QLatin1String,_QChar> *pQVar28;
  size_t sVar29;
  ulong uVar30;
  FILE *pFVar31;
  char *b;
  char *pcVar32;
  PropertyDef *pPVar33;
  PropertyDef *p;
  PropertyDef *pPVar34;
  QList<ClassDef::Interface> *pQVar35;
  PropertyDef *pPVar36;
  QByteArray *ba;
  long lVar37;
  QByteArray *lhs;
  EnumDef *pEVar38;
  _Rb_tree_node_base *p_Var39;
  long in_FS_OFFSET;
  bool bVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  undefined8 *local_160;
  QStringTokenizerBase<QLatin1String,_QChar> *local_158;
  QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&> local_150;
  QByteArray local_138;
  QMultiHash<QByteArray,_QByteArray> local_118;
  QByteArray qualifiedClassNameIdentifier;
  QByteArray local_e8;
  iterator __begin1;
  QArrayDataPointer<QByteArray> local_80;
  QFlags<QtMocConstants::EnumFlags> QStack_68;
  undefined4 uStack_64;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)0x1412c5;
  bVar7 = operator==((QByteArray *)this->cdef,(char **)&__begin1);
  pCVar19 = this->cdef;
  lVar14 = (pCVar19->constructorList).d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
  local_58.m_haystack.m_size = 0;
  local_58.m_haystack.m_data = (char *)0x0;
  lVar25 = (pCVar19->super_BaseDef).enumList.d.size;
  if (lVar25 != 0) {
    pEVar27 = (pCVar19->super_BaseDef).enumList.d.ptr;
    pEVar38 = pEVar27 + lVar25;
    do {
      __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)(pEVar27->name).d.d;
      __begin1.current.value.m_size = (qsizetype)(pEVar27->name).d.ptr;
      __begin1.current.value.m_data = (char *)(pEVar27->name).d.size;
      if (__begin1.tokenizer != (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
        LOCK();
        (((QArrayData *)&(__begin1.tokenizer)->super_QStringTokenizerBaseBase)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&(__begin1.tokenizer)->super_QStringTokenizerBaseBase)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __begin1.current._16_8_ = (pEVar27->enumName).d.d;
      __begin1.current.state.start = (qsizetype)(pEVar27->enumName).d.ptr;
      __begin1.current.state.end = (pEVar27->enumName).d.size;
      if ((Data *)__begin1.current._16_8_ != (Data *)0x0) {
        LOCK();
        (((Data *)__begin1.current._16_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>
        ._M_i = (((Data *)__begin1.current._16_8_)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __begin1.current.state.extra = (qsizetype)(pEVar27->type).d.d;
      if ((Data *)__begin1.current.state.extra != (Data *)0x0) {
        LOCK();
        (((Data *)__begin1.current.state.extra)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             (((Data *)__begin1.current.state.extra)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_80.d = (pEVar27->values).d.d;
      local_80.ptr = (pEVar27->values).d.ptr;
      local_80.size = (pEVar27->values).d.size;
      if (local_80.d != (Data *)0x0) {
        LOCK();
        ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uStack_64 = 0xaaaaaaaa;
      QStack_68.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (pEVar27->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      pCVar19 = this->cdef;
      pQVar2 = (pCVar19->super_BaseDef).enumDeclarations.d.d.ptr;
      if ((pQVar2 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                      *)0x0) &&
         (cVar11 = std::
                   _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                   ::find(&(pQVar2->m)._M_t,(key_type *)&__begin1),
         (_Rb_tree_header *)cVar11._M_node !=
         &(((pCVar19->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
          super__Rb_tree_header)) {
        QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
                  ((QMovableArrayOps<EnumDef> *)&local_58,(qsizetype)local_58.m_haystack.m_data,
                   (EnumDef *)&__begin1);
        QList<EnumDef>::end((QList<EnumDef> *)&local_58);
      }
      QByteArray::operator=((QByteArray *)&__begin1.current.ok,(QByteArray *)&__begin1);
      local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      qualifiedClassNameIdentifier.d.d = (Data *)0x0;
      qualifiedClassNameIdentifier.d.ptr = (char *)0x0;
      qualifiedClassNameIdentifier.d.size = 0;
      QMap<QByteArray,_QByteArray>::value
                (&local_e8,&(this->cdef->super_BaseDef).flagAliases,(QByteArray *)&__begin1,
                 &qualifiedClassNameIdentifier);
      if (qualifiedClassNameIdentifier.d.d != (Data *)0x0) {
        LOCK();
        ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(qualifiedClassNameIdentifier.d.d)->super_QArrayData,1,0x10);
        }
      }
      pCVar19 = this->cdef;
      pQVar2 = (pCVar19->super_BaseDef).enumDeclarations.d.d.ptr;
      if ((pQVar2 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                      *)0x0) &&
         (cVar11 = std::
                   _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                   ::find(&(pQVar2->m)._M_t,&local_e8),
         (_Rb_tree_header *)cVar11._M_node !=
         &(((pCVar19->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
          super__Rb_tree_header)) {
        QByteArray::operator=((QByteArray *)&__begin1,&local_e8);
        pQVar12 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
                            (&(this->cdef->super_BaseDef).enumDeclarations,&local_e8);
        QStack_68.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
        super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
             (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
             (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
             ((uint)QStack_68.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                    super_QFlagsStorage<QtMocConstants::EnumFlags>.i |
             (pQVar12->super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>).
             super_QFlagsStorage<QtMocConstants::EnumFlags>.i);
        QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
                  ((QMovableArrayOps<EnumDef> *)&local_58,(qsizetype)local_58.m_haystack.m_data,
                   (EnumDef *)&__begin1);
        QList<EnumDef>::end((QList<EnumDef> *)&local_58);
      }
      if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_e8.d.d == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_80);
      if (__begin1.current.state.extra != 0) {
        LOCK();
        *(int *)__begin1.current.state.extra = *(int *)__begin1.current.state.extra + -1;
        UNLOCK();
        if (*(int *)__begin1.current.state.extra == 0) {
          QArrayData::deallocate((QArrayData *)__begin1.current.state.extra,1,0x10);
        }
      }
      if (__begin1.current._16_8_ != 0) {
        LOCK();
        *(int *)__begin1.current._16_8_ = *(int *)__begin1.current._16_8_ + -1;
        UNLOCK();
        if (*(int *)__begin1.current._16_8_ == 0) {
          QArrayData::deallocate((QArrayData *)__begin1.current._16_8_,1,0x10);
        }
      }
      if (__begin1.tokenizer != (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
        LOCK();
        ((__begin1.tokenizer)->super_QStringTokenizerBaseBase).m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             ((__begin1.tokenizer)->super_QStringTokenizerBaseBase).m_sb.
             super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
             super_QFlagsStorage<Qt::SplitBehaviorFlags>.i - 1;
        UNLOCK();
        if (((__begin1.tokenizer)->super_QStringTokenizerBaseBase).m_sb.
            super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
            super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == 0) {
          QArrayData::deallocate((QArrayData *)__begin1.tokenizer,1,0x10);
        }
      }
      pEVar27 = pEVar27 + 1;
    } while (pEVar27 != pEVar38);
    pCVar19 = this->cdef;
  }
  QArrayDataPointer<EnumDef>::operator=
            (&(pCVar19->super_BaseDef).enumList.d,(QArrayDataPointer<EnumDef> *)&local_58);
  QArrayDataPointer<EnumDef>::~QArrayDataPointer((QArrayDataPointer<EnumDef> *)&local_58);
  strreg(this,&(this->cdef->super_BaseDef).qualified);
  registerClassInfoStrings(this);
  registerFunctionStrings(this,&this->cdef->signalList);
  registerFunctionStrings(this,&this->cdef->slotList);
  registerFunctionStrings(this,&this->cdef->methodList);
  registerFunctionStrings(this,&this->cdef->constructorList);
  lVar25 = (this->cdef->nonClassSignalList).d.size;
  if (lVar25 != 0) {
    pQVar24 = (this->cdef->nonClassSignalList).d.ptr;
    lVar25 = lVar25 * 0x18;
    do {
      strreg(this,pQVar24);
      pQVar24 = pQVar24 + 1;
      lVar25 = lVar25 + -0x18;
    } while (lVar25 != 0);
  }
  registerPropertyStrings(this);
  registerEnumStrings(this);
  pCVar19 = this->cdef;
  cVar8 = '\x01';
  if (this->requireCompleteTypes == false) {
    cVar8 = pCVar19->requireCompleteMethodTypes;
  }
  if (((pCVar19->hasQObject == false) && ((pCVar19->methodList).d.size == 0)) &&
     ((pCVar19->propertyList).d.size == 0)) {
    bVar40 = (pCVar19->constructorList).d.size == 0;
  }
  else {
    bVar40 = false;
  }
  bVar1 = (this->parser->super_Parser).activeQtMode;
  qualifiedClassNameIdentifier.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  qualifiedClassNameIdentifier.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  qualifiedClassNameIdentifier.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&qualifiedClassNameIdentifier,"ZN",-1);
  local_58.m_haystack.m_data = (pCVar19->super_BaseDef).qualified.d.ptr;
  local_58.m_haystack.m_size = (pCVar19->super_BaseDef).qualified.d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_58.m_needle.ucs = L':';
  __begin1.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __begin1.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __begin1.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __begin1.current.value.m_data = &DAT_aaaaaaaaaaaaaaaa;
  __begin1.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
  __begin1.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator(&__begin1,&local_58);
  if (__begin1.current.ok == true) {
    do {
      qVar6 = __begin1.current.value.m_size;
      QByteArray::number((longlong)&local_e8,(int)__begin1.current.value.m_size);
      QByteArray::append(&qualifiedClassNameIdentifier);
      if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_e8.d.d == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
        }
      }
      QVar41.m_data = (storage_type *)qVar6;
      QVar41.m_size = qualifiedClassNameIdentifier.d.size;
      QByteArray::insert((longlong)&qualifiedClassNameIdentifier,QVar41);
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(&__begin1);
    } while (__begin1.current.ok != false);
  }
  QByteArray::append((char)&qualifiedClassNameIdentifier);
  pCVar19 = this->cdef;
  if (pCVar19->hasQNamespace == false) {
    pDVar3 = (pCVar19->super_BaseDef).classname.d.d;
    if ((pDVar3 == (Data *)0x0) || (1 < (int)(pDVar3->super_QArrayData).ref_._q_value)) {
      QByteArray::reallocData
                ((longlong)pCVar19,(AllocationOption)(pCVar19->super_BaseDef).classname.d.size);
    }
    pcVar32 = (pCVar19->super_BaseDef).classname.d.ptr;
  }
  else {
    pcVar32 = anon_var_dwarf_3fa0a;
  }
  pcVar22 = qualifiedClassNameIdentifier.d.ptr;
  if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
    pcVar22 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"namespace {\nstruct qt_meta_tag_%s_t {};\n} // unnamed namespace\n\n",
          pcVar22);
  pcVar22 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar22 == (char *)0x0) {
    pcVar22 = (char *)&QByteArray::_empty;
  }
  pcVar20 = qualifiedClassNameIdentifier.d.ptr;
  if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
    pcVar20 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n{\n    namespace QMC = QtMocConstants;\n"
          ,pcVar22,pcVar20);
  fwrite("    QtMocHelpers::StringRefStorage qt_stringData {",0x32,1,(FILE *)this->out);
  addStrings(this,&this->strings);
  fwrite("\n    };\n\n",9,1,(FILE *)this->out);
  fwrite("    QtMocHelpers::UintData qt_methods {\n",0x28,1,(FILE *)this->out);
  addFunctions(this,&this->cdef->signalList,"Signal");
  addFunctions(this,&this->cdef->slotList,"Slot");
  addFunctions(this,&this->cdef->methodList,"Method");
  fwrite("    };\n    QtMocHelpers::UintData qt_properties {\n",0x32,1,(FILE *)this->out);
  addProperties(this);
  fwrite("    };\n    QtMocHelpers::UintData qt_enums {\n",0x2d,1,(FILE *)this->out);
  addEnums(this);
  fwrite("    };\n",7,1,(FILE *)this->out);
  if (lVar14 == 0) {
    pCVar19 = this->cdef;
    if ((pCVar19->super_BaseDef).classInfoList.d.size == 0) {
      pcVar22 = "";
      goto LAB_00108781;
    }
    fputs("    QtMocHelpers::UintData qt_constructors {};\n",(FILE *)this->out);
  }
  else {
    fwrite("    using Constructor = QtMocHelpers::NoType;\n    QtMocHelpers::UintData qt_constructors {\n"
           ,0x5b,1,(FILE *)this->out);
    addFunctions(this,&this->cdef->constructorList,"Constructor");
    fwrite("    };\n",7,1,(FILE *)this->out);
  }
  pCVar19 = this->cdef;
  if ((pCVar19->super_BaseDef).classInfoList.d.size == 0) {
    pcVar22 = ", qt_constructors";
  }
  else {
    fwrite("    QtMocHelpers::ClassInfos qt_classinfo({\n",0x2c,1,(FILE *)this->out);
    addClassInfos(this);
    fwrite("    });\n",8,1,(FILE *)this->out);
    pCVar19 = this->cdef;
    pcVar22 = ", qt_constructors, qt_classinfo";
  }
LAB_00108781:
  if ((pCVar19->hasQGadget == false) && (pCVar19->hasQNamespace != true)) {
    pcVar20 = "QMC::MetaObjectFlag{}";
  }
  else {
    pcVar20 = "QMC::PropertyAccessInStaticMetaCall";
  }
  if (cVar8 == '\0') {
    local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)((long)"<qt_meta_tag_" + 1);
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    local_58.m_haystack.m_data = "_t";
    QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              ((QByteArray *)&__begin1,
               (QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>
                *)&local_58);
    pcVar21 = (char *)__begin1.current.value.m_size;
    pQVar28 = __begin1.tokenizer;
  }
  else {
    pcVar21 = anon_var_dwarf_3fa0a;
    pQVar28 = (QStringTokenizerBase<QLatin1String,_QChar> *)0x0;
  }
  if (pcVar21 == (char *)0x0) {
    pcVar21 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n            qt_methods, qt_properties, qt_enums%s);\n}\n"
          ,pcVar32,pcVar21,pcVar20,pcVar22);
  if (pQVar28 != (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
    LOCK();
    ((__atomic_base<int> *)
    &(pQVar28->super_QStringTokenizerBaseBase).m_sb.
     super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
         ((__atomic_base<int> *)
         &(pQVar28->super_QStringTokenizerBaseBase).m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)
        &(pQVar28->super_QStringTokenizerBaseBase).m_sb.
         super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)pQVar28,1,0x10);
    }
  }
  if (this->cdef->hasQNamespace == true) {
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i._0_1_ = 0x5f;
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    QStringBuilder<char,_const_QByteArray_&>::convertTo<QByteArray>
              ((QByteArray *)&__begin1,(QStringBuilder<char,_const_QByteArray_&> *)&local_58);
    local_158 = __begin1.tokenizer;
    local_160 = (undefined8 *)__begin1.current.value.m_size;
    puVar23 = (undefined8 *)__begin1.current.value.m_size;
    if (__begin1.current.value.m_size == 0) {
      puVar23 = &QByteArray::_empty;
    }
    pcVar32 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar32 == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nstatic constexpr auto qt_staticMetaObjectContent%s =\n    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();\nstatic constexpr auto qt_staticMetaObjectStaticContent%s =\n    qt_staticMetaObjectContent%s.staticData;\nstatic constexpr auto qt_staticMetaObjectRelocatingContent%s =\n    qt_staticMetaObjectContent%s.relocatingData;\n\n"
            ,puVar23,pcVar32,puVar23,puVar23,puVar23,puVar23,puVar23);
  }
  else {
    local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)0x13e805;
    local_58.m_haystack.m_size = (qsizetype)&qualifiedClassNameIdentifier;
    local_58.m_haystack.m_data = "_t>";
    QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>::
    convertTo<QByteArray>
              ((QByteArray *)&__begin1,
               (QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>
                *)&local_58);
    local_158 = __begin1.tokenizer;
    local_160 = (undefined8 *)__begin1.current.value.m_size;
  }
  __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)0x0;
  __begin1.current.value.m_size = 0;
  __begin1.current.value.m_data = (char *)0x0;
  local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QByteArray,_QByteArray>::QMultiHash(&local_118,&this->knownGadgets);
  QMultiHash<QByteArray,_QByteArray>::unite(&local_118,&this->knownQObjectClasses);
  pCVar19 = this->cdef;
  lVar14 = (pCVar19->propertyList).d.size;
  if (lVar14 != 0) {
    pPVar34 = (pCVar19->propertyList).d.ptr;
    pPVar33 = pPVar34 + lVar14;
    do {
      bVar9 = isBuiltinType(&pPVar34->type);
      if (!bVar9) {
        pcVar32 = (pPVar34->type).d.ptr;
        sVar29 = (pPVar34->type).d.size;
        if (((sVar29 == 0) ||
            (((pvVar13 = memchr(pcVar32,0x2a,sVar29),
              pvVar13 == (void *)0x0 || (long)pvVar13 - (long)pcVar32 == -1 &&
              (pvVar13 = memchr(pcVar32,0x3c,sVar29),
              pvVar13 == (void *)0x0 || (long)pvVar13 - (long)pcVar32 == -1)) &&
             (pvVar13 = memchr(pcVar32,0x3e,sVar29),
             pvVar13 == (void *)0x0 || (long)pvVar13 - (long)pcVar32 == -1)))) &&
           (QVar42.m_data = pcVar32, QVar42.m_size = sVar29, QVar45.m_data = "::", QVar45.m_size = 2
           , lVar14 = QtPrivate::lastIndexOf(QVar42,sVar29,QVar45), 0 < lVar14)) {
          local_58.m_haystack.m_data = &DAT_aaaaaaaaaaaaaaaa;
          local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)&DAT_aaaaaaaaaaaaaaaa;
          local_58.m_haystack.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::left((QByteArray *)&local_58,&pPVar34->type,lVar14);
          pCVar19 = this->cdef;
          local_e8.d.d = (pCVar19->super_BaseDef).qualified.d.d;
          local_e8.d.ptr = (pCVar19->super_BaseDef).qualified.d.ptr;
          local_e8.d.size = (pCVar19->super_BaseDef).qualified.d.size;
          if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
            LOCK();
            *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
            UNLOCK();
          }
          do {
            qVar6 = local_e8.d.size;
            pcVar32 = local_e8.d.ptr;
            QVar43.m_data = local_e8.d.ptr;
            QVar43.m_size = local_e8.d.size;
            QVar46.m_data = "::";
            QVar46.m_size = 2;
            lVar15 = QtPrivate::lastIndexOf(QVar43,local_e8.d.size,QVar46);
            if (lVar15 < qVar6) {
              if (lVar15 < 1) {
                lVar15 = 0;
              }
              QByteArray::QByteArray(&local_138,pcVar32,lVar15);
              QVar16 = (QStringTokenizerBaseBase)local_e8.d.d;
            }
            else {
              local_138.d.d = local_e8.d.d;
              local_138.d.ptr = pcVar32;
              if ((QStringTokenizerBaseBase)local_e8.d.d == (QStringTokenizerBaseBase)0x0) {
                QVar16.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                     (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
                QVar16.m_cs = CaseInsensitive;
                local_138.d.size = qVar6;
              }
              else {
                LOCK();
                *(int *)local_e8.d.d = *(int *)local_e8.d.d + 1;
                UNLOCK();
                QVar16 = (QStringTokenizerBaseBase)local_e8.d.d;
                local_138.d.size = qVar6;
              }
            }
            pcVar32 = local_e8.d.ptr;
            qVar6 = local_138.d.size;
            local_e8.d.d = local_138.d.d;
            local_e8.d.ptr = local_138.d.ptr;
            local_138.d.ptr = pcVar32;
            local_138.d.size = local_e8.d.size;
            local_e8.d.size = qVar6;
            if (QVar16 != (QStringTokenizerBaseBase)0x0) {
              LOCK();
              *(int *)QVar16 = *(int *)QVar16 + -1;
              UNLOCK();
              if (*(int *)QVar16 == 0) {
                local_138.d.d = (Data *)QVar16;
                QArrayData::deallocate((QArrayData *)QVar16,1,0x10);
              }
            }
            local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_138.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            if ((char *)local_e8.d.size == (char *)0x0) {
              local_138.d.d = (Data *)local_58.super_QStringTokenizerBaseBase;
              local_138.d.ptr = (char *)local_58.m_haystack.m_size;
              local_138.d.size = (qsizetype)local_58.m_haystack.m_data;
              if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                LOCK();
                *(int *)local_58.super_QStringTokenizerBaseBase =
                     *(int *)local_58.super_QStringTokenizerBaseBase + 1;
                UNLOCK();
              }
            }
            else {
              local_150.a.a = &local_e8;
              local_150.a.b = (char (*) [3])0x13e817;
              local_150.b = (QByteArray *)&local_58;
              QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&>::
              convertTo<QByteArray>(&local_138,&local_150);
            }
            QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                      ((const_iterator *)&local_150,&local_118,&local_138);
            pQVar24 = local_150.b;
            if ((QStringTokenizerBaseBase)local_138.d.d != (QStringTokenizerBaseBase)0x0) {
              LOCK();
              *(int *)local_138.d.d = *(int *)local_138.d.d + -1;
              UNLOCK();
              if (*(int *)local_138.d.d == 0) {
                QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((char *)local_e8.d.size == (char *)0x0) {
              if ((QStringTokenizerBase<QLatin1String,_QChar> *)pQVar24 ==
                  (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) goto LAB_00108cdb;
              break;
            }
          } while ((QStringTokenizerBase<QLatin1String,_QChar> *)pQVar24 ==
                   (QStringTokenizerBase<QLatin1String,_QChar> *)0x0);
          QVar16 = *(QStringTokenizerBaseBase *)&pQVar24->d;
          local_138.d.d = (Data *)0x13e81a;
          bVar9 = operator==((QByteArray *)QVar16,(char **)&local_138);
          if ((!bVar9) &&
             (bVar9 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,
                                          (QByteArray *)QVar16),
             qVar6 = __begin1.current.value.m_size, !bVar9)) {
            if (__begin1.current.value.m_data != (char *)0x0) {
              lVar14 = (long)__begin1.current.value.m_data * 0x18;
              lVar25 = 0;
              do {
                if (lVar14 == lVar25) goto LAB_00108cb8;
                bVar9 = operator==((QByteArray *)(qVar6 + lVar25),(QByteArray *)QVar16);
                lVar25 = lVar25 + 0x18;
              } while (!bVar9);
              if (__begin1.current.value.m_size - qVar6 != lVar25) goto LAB_00108cdb;
            }
LAB_00108cb8:
            QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                      ((QMovableArrayOps<QByteArray> *)&__begin1,
                       (qsizetype)__begin1.current.value.m_data,(QByteArray *)QVar16);
            QList<QByteArray>::end((QList<QByteArray> *)&__begin1);
          }
LAB_00108cdb:
          if ((QStringTokenizerBaseBase)local_e8.d.d != (QStringTokenizerBaseBase)0x0) {
            LOCK();
            *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
            UNLOCK();
            if (*(int *)local_e8.d.d == 0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
            LOCK();
            *(int *)local_58.super_QStringTokenizerBaseBase =
                 *(int *)local_58.super_QStringTokenizerBaseBase + -1;
            UNLOCK();
            if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
              QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
            }
          }
        }
      }
      pPVar34 = pPVar34 + 1;
    } while (pPVar34 != pPVar33);
    pCVar19 = this->cdef;
  }
  pQVar2 = (pCVar19->super_BaseDef).enumDeclarations.d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var17 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var17 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var39 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var39 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var17 != p_Var39; p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
    QVar44.m_data = (storage_type *)p_Var17[1]._M_parent;
    QVar44.m_size = (qsizetype)p_Var17[1]._M_left;
    QVar47.m_data = "::";
    QVar47.m_size = 2;
    lVar14 = QtPrivate::lastIndexOf(QVar44,(longlong)p_Var17[1]._M_left,QVar47);
    if (0 < lVar14) {
      local_58.m_haystack.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m_haystack.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::left((QByteArray *)&local_58,(QByteArray *)(p_Var17 + 1),lVar14);
      local_e8.d.d = (Data *)0x13e81a;
      bVar9 = operator!=((QByteArray *)&local_58,(char **)&local_e8);
      if ((bVar9) &&
         (bVar9 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,(QByteArray *)&local_58
                                     ), pcVar22 = local_58.m_haystack.m_data,
         __s2 = local_58.m_haystack.m_size, pcVar32 = __begin1.current.value.m_data,
         qVar6 = __begin1.current.value.m_size, !bVar9)) {
        if (__begin1.current.value.m_data != (char *)0x0) {
          lVar14 = (long)__begin1.current.value.m_data * 0x18;
          lVar25 = 0;
          do {
            if ((*(char **)(qVar6 + 0x10 + lVar25) == pcVar22) &&
               ((pcVar22 == (char *)0x0 ||
                (iVar10 = bcmp(*(void **)(qVar6 + 8 + lVar25),(void *)__s2,(size_t)pcVar22),
                iVar10 == 0)))) {
              if (lVar25 != -0x18) goto LAB_00108ec0;
              break;
            }
            lVar25 = lVar25 + 0x18;
          } while (lVar14 != lVar25);
        }
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                  ((QMovableArrayOps<QByteArray> *)&__begin1,(qsizetype)pcVar32,
                   (QByteArray *)&local_58);
        QList<QByteArray>::end((QList<QByteArray> *)&__begin1);
      }
LAB_00108ec0:
      if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_58.super_QStringTokenizerBaseBase =
             *(int *)local_58.super_QStringTokenizerBaseBase + -1;
        UNLOCK();
        if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
          QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
        }
      }
    }
  }
  if (__begin1.current.value.m_data != (char *)0x0) {
    pcVar32 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",pcVar32);
    qVar6 = __begin1.current.value.m_size;
    if (__begin1.current.value.m_data != (char *)0x0) {
      lVar14 = (long)__begin1.current.value.m_data * 0x18;
      lVar25 = 0;
      do {
        puVar23 = *(undefined8 **)(qVar6 + 8 + lVar25);
        if (puVar23 == (undefined8 *)0x0) {
          puVar23 = &QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n",
                puVar23);
        lVar25 = lVar25 + 0x18;
      } while (lVar14 != lVar25);
    }
    fwrite("    nullptr\n};\n\n",0x10,1,(FILE *)this->out);
  }
  pcVar32 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar32 == (char *)0x0) {
    pcVar32 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",pcVar32);
  if ((bVar7) || (pCVar19 = this->cdef, (pCVar19->superclassList).d.size == 0)) {
    fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
  }
  else {
    if ((pCVar19->hasQGadget == false) && (pCVar19->hasQNamespace == false)) {
      pFVar31 = (FILE *)this->out;
      pcVar32 = (this->purestSuperClass).d.ptr;
      if (pcVar32 == (char *)0x0) {
        pcVar32 = (char *)&QByteArray::_empty;
      }
      pcVar22 = "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n";
    }
    else {
      pFVar31 = (FILE *)this->out;
      pcVar32 = (this->purestSuperClass).d.ptr;
      if (pcVar32 == (char *)0x0) {
        pcVar32 = (char *)&QByteArray::_empty;
      }
      pcVar22 = "    QtPrivate::MetaObjectForType<%s>::value,\n";
    }
    fprintf(pFVar31,pcVar22,pcVar32);
  }
  if (local_160 == (undefined8 *)0x0) {
    local_160 = &QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    qt_staticMetaObjectStaticContent%s.stringdata,\n    qt_staticMetaObjectStaticContent%s.data,\n"
          ,local_160,local_160);
  if (bVar40 || bVar1 != false) {
    pcVar32 = "    nullptr,\n";
    sVar29 = 0xd;
  }
  else {
    pcVar32 = "    qt_static_metacall,\n";
    sVar29 = 0x18;
  }
  fwrite(pcVar32,sVar29,1,(FILE *)this->out);
  if (__begin1.current.value.m_data == (char *)0x0) {
    fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
  }
  else {
    pcVar32 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    qt_meta_extradata_%s,\n",pcVar32);
  }
  fprintf((FILE *)this->out,"    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",local_160);
  fwrite("    nullptr\n} };\n\n",0x12,1,(FILE *)this->out);
  if (!bVar40 && bVar1 == false) {
    generateStaticMetacall(this);
  }
  if (this->cdef->hasQObject == true) {
    pcVar32 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar32 == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nconst QMetaObject *%s::metaObject() const\n{\n    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n}\n"
            ,pcVar32);
    pcVar32 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar32 == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"\nvoid *%s::qt_metacast(const char *_clname)\n{\n",pcVar32);
    fwrite("    if (!_clname) return nullptr;\n",0x22,1,(FILE *)this->out);
    pcVar32 = qualifiedClassNameIdentifier.d.ptr;
    if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
      pcVar32 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n        return static_cast<void*>(this);\n"
            ,pcVar32);
    pCVar19 = this->cdef;
    uVar30 = (pCVar19->superclassList).d.size;
    if (1 < uVar30) {
      pSVar4 = (pCVar19->superclassList).d.ptr;
      lVar14 = 0;
      do {
        if (*(int *)((long)&pSVar4[1].access + lVar14) != 0) {
          puVar23 = *(undefined8 **)((long)&pSVar4[1].classname.d.ptr + lVar14);
          if (puVar23 == (undefined8 *)0x0) {
            puVar23 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                  puVar23);
        }
        lVar14 = lVar14 + 0x38;
      } while (uVar30 * 0x38 + -0x38 != lVar14);
      pCVar19 = this->cdef;
    }
    lVar14 = (pCVar19->interfaceList).d.size;
    if (lVar14 != 0) {
      pQVar35 = (pCVar19->interfaceList).d.ptr;
      pQVar18 = pQVar35 + lVar14;
      do {
        if ((pQVar35->d).size != 0) {
          lVar14 = -1;
          lVar25 = 8;
          uVar30 = 0;
          do {
            pcVar32 = (pQVar35->d).ptr[uVar30].interfaceId.d.ptr;
            if (pcVar32 == (char *)0x0) {
              pcVar32 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,"    if (!strcmp(_clname, %s))\n        return ",pcVar32);
            lVar26 = lVar14;
            lVar37 = lVar25;
            do {
              puVar23 = *(undefined8 **)((long)&(((pQVar35->d).ptr)->className).d.d + lVar37);
              if (puVar23 == (undefined8 *)0x0) {
                puVar23 = &QByteArray::_empty;
              }
              fprintf((FILE *)this->out,"static_cast< %s*>(",puVar23);
              lVar37 = lVar37 + -0x30;
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0);
            pFVar31 = (FILE *)this->out;
            uVar30 = uVar30 + 1;
            QByteArray::QByteArray((QByteArray *)&local_58,uVar30,')');
            pQVar24 = (QByteArray *)local_58.m_haystack.m_size;
            if ((QByteArray *)local_58.m_haystack.m_size == (QByteArray *)0x0) {
              pQVar24 = (QByteArray *)&QByteArray::_empty;
            }
            fprintf(pFVar31,"this%s;\n",pQVar24);
            if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
              LOCK();
              *(int *)local_58.super_QStringTokenizerBaseBase =
                   *(int *)local_58.super_QStringTokenizerBaseBase + -1;
              UNLOCK();
              if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
                QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10)
                ;
              }
            }
            lVar14 = lVar14 + -1;
            lVar25 = lVar25 + 0x30;
          } while (uVar30 < (ulong)(pQVar35->d).size);
        }
        pQVar35 = pQVar35 + 1;
      } while (pQVar35 != pQVar18);
    }
    if (bVar7 || (this->purestSuperClass).d.size == 0) {
      fwrite("    return nullptr;\n",0x14,1,(FILE *)this->out);
    }
    else {
      pQVar5 = &((this->purestSuperClass).d.d)->super_QArrayData;
      pcVar32 = (this->purestSuperClass).d.ptr;
      if (pQVar5 == (QArrayData *)0x0) {
        if (pcVar32 == (char *)0x0) {
          pcVar32 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    return %s::qt_metacast(_clname);\n",pcVar32);
      }
      else {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (pcVar32 == (char *)0x0) {
          pcVar32 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    return %s::qt_metacast(_clname);\n",pcVar32);
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,1,0x10);
        }
      }
    }
    fwrite("}\n",2,1,(FILE *)this->out);
    if ((this->parser->super_Parser).activeQtMode == false) {
      generateMetacall(this);
      pCVar19 = this->cdef;
      if (0 < (int)(pCVar19->signalList).d.size) {
        lVar14 = 0;
        lVar25 = 0;
        do {
          generateSignal(this,(FunctionDef *)
                              ((long)&(((pCVar19->signalList).d.ptr)->type).name.d.d + lVar14),
                         (int)lVar25);
          lVar25 = lVar25 + 1;
          pCVar19 = this->cdef;
          lVar14 = lVar14 + 0xd0;
        } while (lVar25 < (int)(pCVar19->signalList).d.size);
      }
      generatePluginMetaData(this);
      if ((this->cdef->nonClassSignalList).d.size != 0) {
        pcVar32 = qualifiedClassNameIdentifier.d.ptr;
        if (qualifiedClassNameIdentifier.d.ptr == (char *)0x0) {
          pcVar32 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"namespace CheckNotifySignalValidity_%s {\n",pcVar32);
        lVar14 = (this->cdef->nonClassSignalList).d.size;
        if (lVar14 != 0) {
          lhs = (this->cdef->nonClassSignalList).d.ptr;
          pQVar24 = lhs + lVar14;
          do {
            pPVar34 = (this->cdef->propertyList).d.ptr;
            lVar14 = (this->cdef->propertyList).d.size;
            lVar25 = lVar14;
            pPVar33 = pPVar34;
            if (0 < lVar14 >> 2) {
              lVar26 = (lVar14 >> 2) + 1;
              lVar25 = 0;
              do {
                lVar37 = lVar25;
                bVar7 = operator==(lhs,(QByteArray *)((long)&(pPVar34->notify).d.d + lVar37));
                if (bVar7) {
                  pPVar36 = (PropertyDef *)((long)&(pPVar34->name).d.d + lVar37);
                  goto LAB_00109686;
                }
                bVar7 = operator==(lhs,(QByteArray *)((long)&pPVar34[1].notify.d.d + lVar37));
                if (bVar7) {
                  pPVar36 = (PropertyDef *)((long)&pPVar34[1].name.d.d + lVar37);
                  goto LAB_00109686;
                }
                bVar7 = operator==(lhs,(QByteArray *)((long)&pPVar34[2].notify.d.d + lVar37));
                if (bVar7) {
                  pPVar36 = (PropertyDef *)((long)&pPVar34[2].name.d.d + lVar37);
                  goto LAB_00109686;
                }
                bVar7 = operator==(lhs,(QByteArray *)((long)&pPVar34[3].notify.d.d + lVar37));
                if (bVar7) {
                  pPVar36 = (PropertyDef *)((long)&pPVar34[3].name.d.d + lVar37);
                  goto LAB_00109686;
                }
                lVar26 = lVar26 + -1;
                lVar25 = lVar37 + 0x560;
              } while (1 < lVar26);
              lVar25 = (lVar14 * 0x158 - (lVar37 + 0x560) >> 3) * -0x7d05f417d05f417d;
              pPVar33 = (PropertyDef *)((long)&pPVar34[4].name.d.d + lVar37);
            }
            if (lVar25 == 1) {
LAB_00109670:
              bVar7 = operator==(lhs,&pPVar33->notify);
              pPVar36 = pPVar34 + lVar14;
              if (bVar7) {
                pPVar36 = pPVar33;
              }
            }
            else if (lVar25 == 2) {
LAB_0010961d:
              bVar7 = operator==(lhs,&pPVar33->notify);
              pPVar36 = pPVar33;
              if (!bVar7) {
                pPVar33 = pPVar33 + 1;
                goto LAB_00109670;
              }
            }
            else {
              pPVar36 = pPVar34 + lVar14;
              if ((lVar25 == 3) &&
                 (bVar7 = operator==(lhs,&pPVar33->notify), pPVar36 = pPVar33, !bVar7)) {
                pPVar33 = pPVar33 + 1;
                goto LAB_0010961d;
              }
            }
LAB_00109686:
            pcVar32 = (lhs->d).ptr;
            if (pcVar32 == (char *)0x0) {
              pcVar32 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n"
                    ,pcVar32);
            pcVar32 = (lhs->d).ptr;
            if (pcVar32 == (char *)0x0) {
              pcVar32 = (char *)&QByteArray::_empty;
            }
            pcVar22 = (pPVar36->type).d.ptr;
            if (pcVar22 == (char *)0x0) {
              pcVar22 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n"
                    ,pcVar32,pcVar32,pcVar22);
            pcVar32 = (lhs->d).ptr;
            if (pcVar32 == (char *)0x0) {
              pcVar32 = (char *)&QByteArray::_empty;
            }
            pcVar22 = (this->cdef->super_BaseDef).qualified.d.ptr;
            if (pcVar22 == (char *)0x0) {
              pcVar22 = (char *)&QByteArray::_empty;
            }
            fprintf((FILE *)this->out,
                    "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n"
                    ,pcVar32,pcVar22,pcVar32,pcVar22,pcVar32);
            lhs = lhs + 1;
          } while (lhs != pQVar24);
        }
        fwrite("}\n",2,1,(FILE *)this->out);
      }
    }
  }
  QMultiHash<QByteArray,_QByteArray>::~QMultiHash(&local_118);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&__begin1);
  if (local_158 != (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
    LOCK();
    ((__atomic_base<int> *)
    &(local_158->super_QStringTokenizerBaseBase).m_sb.
     super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
         ((__atomic_base<int> *)
         &(local_158->super_QStringTokenizerBaseBase).m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)
        &(local_158->super_QStringTokenizerBaseBase).m_sb.
         super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_158,1,0x10);
    }
  }
  if (qualifiedClassNameIdentifier.d.d != (Data *)0x0) {
    LOCK();
    ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((qualifiedClassNameIdentifier.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(qualifiedClassNameIdentifier.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateCode()
{
    bool isQObject = (cdef->classname == "QObject");
    bool isConstructible = !cdef->constructorList.isEmpty();

    // filter out undeclared enumerators and sets
    {
        QList<EnumDef> enumList;
        for (EnumDef def : std::as_const(cdef->enumList)) {
            if (cdef->enumDeclarations.contains(def.name)) {
                enumList += def;
            }
            def.enumName = def.name;
            QByteArray alias = cdef->flagAliases.value(def.name);
            if (cdef->enumDeclarations.contains(alias)) {
                def.name = alias;
                def.flags |= cdef->enumDeclarations[alias];
                enumList += def;
            }
        }
        cdef->enumList = enumList;
    }

//
// Register all strings used in data section
//
    strreg(cdef->qualified);
    registerClassInfoStrings();
    registerFunctionStrings(cdef->signalList);
    registerFunctionStrings(cdef->slotList);
    registerFunctionStrings(cdef->methodList);
    registerFunctionStrings(cdef->constructorList);
    registerByteArrayVector(cdef->nonClassSignalList);
    registerPropertyStrings();
    registerEnumStrings();

    const bool requireCompleteness = requireCompleteTypes || cdef->requireCompleteMethodTypes;
    bool hasStaticMetaCall =
            (cdef->hasQObject || !cdef->methodList.isEmpty()
             || !cdef->propertyList.isEmpty() || !cdef->constructorList.isEmpty());
    if (parser->activeQtMode)
        hasStaticMetaCall = false;

    const QByteArray qualifiedClassNameIdentifier = generateQualifiedClassNameIdentifier(cdef->qualified);

    // type name for the Q_OJBECT/GADGET itself, void for namespaces
    const char *ownType = !cdef->hasQNamespace ? cdef->classname.data() : "void";

    // ensure the qt_meta_tag_XXXX_t type is local
    fprintf(out, "namespace {\n"
                 "struct qt_meta_tag_%s_t {};\n"
                 "} // unnamed namespace\n\n",
            qualifiedClassNameIdentifier.constData());

//
// build the strings, data, and metatype arrays
//

    // We define a method inside the context of the class or namespace we're
    // creating the meta object for, so we get access to everything it has
    // access to and with the same contexts (for example, member enums and
    // types).
    fprintf(out, "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n"
                 "{\n"
                 "    namespace QMC = QtMocConstants;\n",
            cdef->qualified.constData(), qualifiedClassNameIdentifier.constData());

    fprintf(out, "    QtMocHelpers::StringRefStorage qt_stringData {");
    addStrings(strings);
    fprintf(out, "\n    };\n\n");

    fprintf(out, "    QtMocHelpers::UintData qt_methods {\n");

    // Build signals array first, otherwise the signal indices would be wrong
    addFunctions(cdef->signalList, "Signal");
    addFunctions(cdef->slotList, "Slot");
    addFunctions(cdef->methodList, "Method");
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_properties {\n");
    addProperties();
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_enums {\n");
    addEnums();
    fprintf(out, "    };\n");

    const char *uintDataParams = "";
    if (isConstructible || !cdef->classInfoList.isEmpty()) {
        if (isConstructible) {
            fprintf(out, "    using Constructor = QtMocHelpers::NoType;\n"
                         "    QtMocHelpers::UintData qt_constructors {\n");
            addFunctions(cdef->constructorList, "Constructor");
            fprintf(out, "    };\n");
        } else {
            fputs("    QtMocHelpers::UintData qt_constructors {};\n", out);
        }

        uintDataParams = ", qt_constructors";
        if (!cdef->classInfoList.isEmpty()) {
            fprintf(out, "    QtMocHelpers::ClassInfos qt_classinfo({\n");
            addClassInfos();
            fprintf(out, "    });\n");
            uintDataParams = ", qt_constructors, qt_classinfo";
        }
    }

    const char *metaObjectFlags = "QMC::MetaObjectFlag{}";
    if (cdef->hasQGadget || cdef->hasQNamespace) {
        // Ideally, all the classes could have that flag. But this broke
        // classes generated by qdbusxml2cpp which generate code that require
        // that we call qt_metacall for properties.
        metaObjectFlags = "QMC::PropertyAccessInStaticMetaCall";
    }
    {
        QByteArray tagType = QByteArrayLiteral("void");
        if (!requireCompleteness)
            tagType = "qt_meta_tag_" + qualifiedClassNameIdentifier +  "_t";
        fprintf(out, "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n"
                     "            qt_methods, qt_properties, qt_enums%s);\n"
                     "}\n",
                ownType, tagType.constData(), metaObjectFlags, uintDataParams);
    }

    QByteArray metaVarNameSuffix;
    if (cdef->hasQNamespace) {
        // Q_NAMESPACE does not define the variables, so we have to. Declare as
        // plain, file-scope static variables (not templates).
        metaVarNameSuffix = '_' + qualifiedClassNameIdentifier;
        const char *n = metaVarNameSuffix.constData();
        fprintf(out, R"(
static constexpr auto qt_staticMetaObjectContent%s =
    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();
static constexpr auto qt_staticMetaObjectStaticContent%s =
    qt_staticMetaObjectContent%s.staticData;
static constexpr auto qt_staticMetaObjectRelocatingContent%s =
    qt_staticMetaObjectContent%s.relocatingData;

)",
                n, cdef->qualified.constData(), n,
                n, n,
                n, n);
    } else {
        // Q_OBJECT and Q_GADGET do declare them, so we just use the templates.
        metaVarNameSuffix = "<qt_meta_tag_" + qualifiedClassNameIdentifier + "_t>";
    }

//
// Build extra array
//
    QList<QByteArray> extraList;
    QMultiHash<QByteArray, QByteArray> knownExtraMetaObject(knownGadgets);
    knownExtraMetaObject.unite(knownQObjectClasses);

    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        if (isBuiltinType(p.type))
            continue;

        if (p.type.contains('*') || p.type.contains('<') || p.type.contains('>'))
            continue;

        const qsizetype s = p.type.lastIndexOf("::");
        if (s <= 0)
            continue;

        QByteArray unqualifiedScope = p.type.left(s);

        // The scope may be a namespace for example, so it's only safe to include scopes that are known QObjects (QTBUG-2151)
        QMultiHash<QByteArray, QByteArray>::ConstIterator scopeIt;

        QByteArray thisScope = cdef->qualified;
        do {
            const qsizetype s = thisScope.lastIndexOf("::");
            thisScope = thisScope.left(s);
            QByteArray currentScope = thisScope.isEmpty() ? unqualifiedScope : thisScope + "::" + unqualifiedScope;
            scopeIt = knownExtraMetaObject.constFind(currentScope);
        } while (!thisScope.isEmpty() && scopeIt == knownExtraMetaObject.constEnd());

        if (scopeIt == knownExtraMetaObject.constEnd())
            continue;

        const QByteArray &scope = *scopeIt;

        if (scope == "Qt")
            continue;
        if (qualifiedNameEquals(cdef->qualified, scope))
            continue;

        if (!extraList.contains(scope))
            extraList += scope;
    }

    // QTBUG-20639 - Accept non-local enums for QML signal/slot parameters.
    // Look for any scoped enum declarations, and add those to the list
    // of extra/related metaobjects for this object.
    for (auto it = cdef->enumDeclarations.keyBegin(),
         end = cdef->enumDeclarations.keyEnd(); it != end; ++it) {
        const QByteArray &enumKey = *it;
        const qsizetype s = enumKey.lastIndexOf("::");
        if (s > 0) {
            QByteArray scope = enumKey.left(s);
            if (scope != "Qt" && !qualifiedNameEquals(cdef->qualified, scope) && !extraList.contains(scope))
                extraList += scope;
        }
    }

//
// Generate meta object link to parent meta objects
//

    if (!extraList.isEmpty()) {
        fprintf(out, "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",
                qualifiedClassNameIdentifier.constData());
        for (const QByteArray &ba : std::as_const(extraList))
            fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", ba.constData());

        fprintf(out, "    nullptr\n};\n\n");
    }

//
// Finally create and initialize the static meta object
//
    fprintf(out, "Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",
            cdef->qualified.constData());

    if (isQObject)
        fprintf(out, "    nullptr,\n");
    else if (cdef->superclassList.size() && !cdef->hasQGadget && !cdef->hasQNamespace) // for qobject, we know the super class must have a static metaobject
        fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", purestSuperClass.constData());
    else if (cdef->superclassList.size()) // for gadgets we need to query at compile time for it
        fprintf(out, "    QtPrivate::MetaObjectForType<%s>::value,\n", purestSuperClass.constData());
    else
        fprintf(out, "    nullptr,\n");
    fprintf(out, "    qt_staticMetaObjectStaticContent%s.stringdata,\n"
            "    qt_staticMetaObjectStaticContent%s.data,\n",
            metaVarNameSuffix.constData(),
            metaVarNameSuffix.constData());
    if (hasStaticMetaCall)
        fprintf(out, "    qt_static_metacall,\n");
    else
        fprintf(out, "    nullptr,\n");

    if (extraList.isEmpty())
        fprintf(out, "    nullptr,\n");
    else
        fprintf(out, "    qt_meta_extradata_%s,\n", qualifiedClassNameIdentifier.constData());

    fprintf(out, "    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",
            metaVarNameSuffix.constData());

    fprintf(out, "    nullptr\n} };\n\n");

//
// Generate internal qt_static_metacall() function
//
    if (hasStaticMetaCall)
        generateStaticMetacall();

    if (!cdef->hasQObject)
        return;

    fprintf(out, "\nconst QMetaObject *%s::metaObject() const\n{\n"
                 "    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n"
                 "}\n",
            cdef->qualified.constData());

//
// Generate smart cast function
//
    fprintf(out, "\nvoid *%s::qt_metacast(const char *_clname)\n{\n", cdef->qualified.constData());
    fprintf(out, "    if (!_clname) return nullptr;\n");
    fprintf(out, "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n"
                  "        return static_cast<void*>(this);\n",
            qualifiedClassNameIdentifier.constData());

    // for all superclasses but the first one
    if (cdef->superclassList.size() > 1) {
        auto it = cdef->superclassList.cbegin() + 1;
        const auto end = cdef->superclassList.cend();
        for (; it != end; ++it) {
            if (it->access == FunctionDef::Private)
                continue;
            const char *cname = it->classname.constData();
            fprintf(out, "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                    cname, cname);
        }
    }

    for (const QList<ClassDef::Interface> &iface : std::as_const(cdef->interfaceList)) {
        for (qsizetype j = 0; j < iface.size(); ++j) {
            fprintf(out, "    if (!strcmp(_clname, %s))\n        return ", iface.at(j).interfaceId.constData());
            for (qsizetype k = j; k >= 0; --k)
                fprintf(out, "static_cast< %s*>(", iface.at(k).className.constData());
            fprintf(out, "this%s;\n", QByteArray(j + 1, ')').constData());
        }
    }
    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    return %s::qt_metacast(_clname);\n", superClass.constData());
    } else {
        fprintf(out, "    return nullptr;\n");
    }
    fprintf(out, "}\n");

    if (parser->activeQtMode)
        return;

//
// Generate internal qt_metacall()  function
//
    generateMetacall();

//
// Generate internal signal functions
//
    for (int signalindex = 0; signalindex < int(cdef->signalList.size()); ++signalindex)
        generateSignal(&cdef->signalList.at(signalindex), signalindex);

//
// Generate plugin meta data
//
    generatePluginMetaData();

//
// Generate function to make sure the non-class signals exist in the parent classes
//
    if (!cdef->nonClassSignalList.isEmpty()) {
        fprintf(out, "namespace CheckNotifySignalValidity_%s {\n", qualifiedClassNameIdentifier.constData());
        for (const QByteArray &nonClassSignal : std::as_const(cdef->nonClassSignalList)) {
            const auto propertyIt = std::find_if(cdef->propertyList.constBegin(),
                                   cdef->propertyList.constEnd(),
                                   [&nonClassSignal](const PropertyDef &p) {
                return nonClassSignal == p.notify;
            });
            // must find something, otherwise checkProperties wouldn't have inserted an entry into nonClassSignalList
            Q_ASSERT(propertyIt != cdef->propertyList.constEnd());
            fprintf(out, "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData());
            const auto &propertyType = propertyIt->type;
            fprintf(out, "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData(),
                    propertyType.constData());
            fprintf(out, "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n"
                         "              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n",
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData());
        }
        fprintf(out, "}\n");
    }
}